

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::updateArrow(QComboBoxPrivate *this,StateFlag state)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  QRect local_b8;
  QStyleOptionComboBox local_a8;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->arrowState != state) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this->arrowState = state;
    memset(&local_a8,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_a8);
    (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&local_a8);
    pQVar1 = this_00->data;
    local_b8.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_b8.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_b8.x1.m_i = 0;
    local_b8.y1.m_i = 0;
    QWidget::update(this_00,&local_b8);
    QIcon::~QIcon(&local_a8.currentIcon);
    if (&(local_a8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_a8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_a8.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateArrow(QStyle::StateFlag state)
{
    Q_Q(QComboBox);
    if (arrowState == state)
        return;
    arrowState = state;
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    q->update(q->rect());
}